

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestSchema::test(TestSchema *this)

{
  ostream *in_RDI;
  TestSchema *in_stack_00000030;
  int in_stack_0000008c;
  TestSchema *in_stack_00000090;
  TestSchema *in_stack_000000f0;
  TestSchema *in_stack_000003e0;
  int in_stack_0000041c;
  TestSchema *in_stack_00000420;
  TestSchema *in_stack_00000440;
  TestSchema *in_stack_00000690;
  TestSchema *in_stack_000006a0;
  
  std::operator<<((ostream *)&std::cout,"Before\n");
  avro::ValidSchema::toJson(in_RDI);
  avro::ValidSchema::toFlatList(in_RDI);
  buildSchema(in_stack_000006a0);
  std::operator<<((ostream *)&std::cout,"After\n");
  avro::ValidSchema::toJson(in_RDI);
  avro::ValidSchema::toFlatList(in_RDI);
  checkNameLookup(in_stack_00000690);
  printEncoding(in_stack_00000030);
  printValidatingEncoding(in_stack_00000090,in_stack_0000008c);
  printValidatingEncoding(in_stack_00000090,in_stack_0000008c);
  printValidatingEncoding(in_stack_00000090,in_stack_0000008c);
  saveValidatingEncoding(in_stack_00000420,in_stack_0000041c);
  readRawData(in_stack_000003e0);
  readValidatedData(in_stack_00000440);
  createExampleSchema(in_stack_000000f0);
  return;
}

Assistant:

void test()
    {
        std::cout << "Before\n";
        schema_.toJson(std::cout);
        schema_.toFlatList(std::cout);
        buildSchema();
        std::cout << "After\n";
        schema_.toJson(std::cout);
        schema_.toFlatList(std::cout);

        checkNameLookup();

        printEncoding();
        printValidatingEncoding(0);
        printValidatingEncoding(1);
        printValidatingEncoding(2);

        saveValidatingEncoding(1);
        readRawData();
        readValidatedData();

        createExampleSchema();
    }